

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

string_view __thiscall
google::protobuf::Reflection::ScratchSpace::CopyFromCord(ScratchSpace *this,Cord *cord)

{
  byte bVar1;
  CordRep *pCVar2;
  char cVar3;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  string_view sVar5;
  string_view fragment;
  ulong local_28;
  char *pcStack_20;
  
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  pCVar2 = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (pCVar2 == (CordRep *)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) == 0) {
      pcStack_20 = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
      local_28 = (ulong)(long)(char)bVar1 >> 1;
    }
    else {
      local_28 = pCVar2->length;
      pcStack_20 = (char *)0x0;
    }
  }
  else {
    local_28 = 0;
    pcStack_20 = (char *)0x0;
    cVar3 = absl::lts_20240722::Cord::GetFlatAux(pCVar2,(basic_string_view *)&local_28);
    if (cVar3 == '\0') {
      _Var4._M_head_impl =
           (this->buffer_)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (_Var4._M_head_impl ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        _Var4._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
        ;
        (_Var4._M_head_impl)->_M_dataplus = (pointer)&(_Var4._M_head_impl)->field_2;
        *(long *)&(_Var4._M_head_impl)->_M_string_length = 0;
        *(string *)&(_Var4._M_head_impl)->field_2 = (string)0x0;
        (this->buffer_)._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl = _Var4._M_head_impl;
      }
      absl::lts_20240722::CopyCordToString(cord,(string *)_Var4._M_head_impl);
      _Var4._M_head_impl =
           (this->buffer_)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      pcStack_20 = ((_Var4._M_head_impl)->_M_dataplus)._M_p;
      local_28 = (_Var4._M_head_impl)->_M_string_length;
    }
  }
  sVar5._M_str = pcStack_20;
  sVar5._M_len = local_28;
  return sVar5;
}

Assistant:

absl::string_view CopyFromCord(const absl::Cord& cord) {
      if (absl::optional<absl::string_view> flat = cord.TryFlat()) {
        return *flat;
      }
      if (!buffer_) {
        buffer_ = absl::make_unique<std::string>();
      }
      absl::CopyCordToString(cord, buffer_.get());
      return *buffer_;
    }